

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

uint __thiscall
ON_MeshComponentRef::GetMeshTopologyEdge(ON_MeshComponentRef *this,ON_MeshTopologyEdge **tope)

{
  uint uVar1;
  bool bVar2;
  ON_MeshTopology *pOVar3;
  ON_MeshTopology *pOVar4;
  
  if (((this->m_mesh_ci).m_type == meshtop_edge) && (-1 < (this->m_mesh_ci).m_index)) {
    pOVar3 = MeshTopology(this);
    bVar2 = true;
    pOVar4 = pOVar3;
    if (pOVar3 != (ON_MeshTopology *)0x0) {
      uVar1 = (this->m_mesh_ci).m_index;
      pOVar4 = (ON_MeshTopology *)(ulong)uVar1;
      if ((int)uVar1 < (pOVar3->m_tope).m_count) {
        *tope = (pOVar3->m_tope).m_a + (int)uVar1;
        bVar2 = false;
      }
    }
    if (!bVar2) {
      return (uint)pOVar4;
    }
  }
  *tope = (ON_MeshTopologyEdge *)0x0;
  return 0xffffffff;
}

Assistant:

unsigned int ON_MeshComponentRef::GetMeshTopologyEdge(
  const struct ON_MeshTopologyEdge*& tope
  ) const
{
  if ( ON_COMPONENT_INDEX::meshtop_edge == m_mesh_ci.m_type && m_mesh_ci.m_index >= 0 )
  {
    const ON_MeshTopology* top = MeshTopology();
    if ( top && m_mesh_ci.m_index < top->m_tope.Count() )
    {
      tope = &top->m_tope[m_mesh_ci.m_index];
      return (unsigned int)m_mesh_ci.m_index;
    }
  }
  tope = 0;
  return ON_UNSET_UINT_INDEX;
}